

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.h
# Opt level: O0

void __thiscall
crnlib::ktx_texture::add_image
          (ktx_texture *this,uint face_index,uint mip_index,void *pImage,uint image_size)

{
  uint i;
  uint uVar1;
  vector<unsigned_char> *this_00;
  uchar *__dest;
  uint8_vec *v;
  uint image_index;
  uint image_size_local;
  void *pImage_local;
  uint mip_index_local;
  uint face_index_local;
  ktx_texture *this_local;
  
  i = get_image_index(this,mip_index,0,face_index,0);
  uVar1 = vector<crnlib::vector<unsigned_char>_>::size(&this->m_image_data);
  if (uVar1 <= i) {
    vector<crnlib::vector<unsigned_char>_>::resize(&this->m_image_data,i + 1,false);
  }
  if (image_size != 0) {
    this_00 = vector<crnlib::vector<unsigned_char>_>::operator[](&this->m_image_data,i);
    vector<unsigned_char>::resize(this_00,image_size,false);
    __dest = vector<unsigned_char>::operator[](this_00,0);
    memcpy(__dest,pImage,(ulong)image_size);
  }
  return;
}

Assistant:

void add_image(uint face_index, uint mip_index, const void* pImage, uint image_size)
        {
            const uint image_index = get_image_index(mip_index, 0, face_index, 0);
            if (image_index >= m_image_data.size())
            {
                m_image_data.resize(image_index + 1);
            }
            if (image_size)
            {
                uint8_vec& v = m_image_data[image_index];
                v.resize(image_size);
                memcpy(&v[0], pImage, image_size);
            }
        }